

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.h
# Opt level: O2

void __thiscall cmQtAutoMocUic::SourceFileT::SourceFileT(SourceFileT *this,string *fileName)

{
  std::__cxx11::string::string((string *)this,(string *)fileName);
  (this->FileTime).NS = 0;
  (this->ParseData).
  super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ParseData).
  super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->BuildPath)._M_dataplus._M_p = (pointer)&(this->BuildPath).field_2;
  (this->BuildPath)._M_string_length = 0;
  (this->BuildPath).field_2._M_local_buf[0] = '\0';
  this->Moc = false;
  this->Uic = false;
  return;
}

Assistant:

SourceFileT(std::string fileName)
      : FileName(std::move(fileName))
    {
    }